

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase43::run(TestCase43 *this)

{
  Builder builder;
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Reader RVar2;
  undefined8 in_stack_fffffffffffffc80;
  bool local_331;
  int local_330;
  bool _kj_shouldLog_3;
  undefined1 local_328 [7];
  bool _kj_shouldLog_2;
  Response<capnproto_test::capnp::test::TestInterface::BazResults> response2;
  bool local_2d1;
  undefined1 auStack_2d0 [7];
  bool _kj_shouldLog_1;
  size_t local_2c8;
  undefined1 local_2c0 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  bool _kj_shouldLog;
  undefined1 local_269 [57];
  undefined1 local_230 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:62:7),_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
  promise3;
  undefined1 local_208 [8];
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  request3;
  undefined1 local_1c8 [7];
  bool barFailed;
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> promise2;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  size_t local_170;
  Maybe<capnp::MessageSize> local_168;
  undefined1 local_150 [8];
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  request2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  undefined1 local_c8 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  undefined1 local_80 [8];
  Client client;
  int callCount;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase43 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  client._16_4_ = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&request1.hook.ptr,(int *)&client.field_0x10);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)local_80,(Own<capnp::_::TestInterfaceImpl> *)&request1.hook.ptr);
  kj::Own<capnp::_::TestInterfaceImpl>::~Own((Own<capnp::_::TestInterfaceImpl> *)&request1.hook.ptr)
  ;
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer,
             (void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_c8,(Client *)local_80,
             (Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise1.super_Pipeline._typeless.ops.disposer);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_c8,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_c8,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&request2.hook.ptr,(int)local_c8,__buf,in_RCX,in_R8D);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_168,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::bazRequest
            ((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
              *)local_150,(Client *)local_80,&local_168);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_168);
  capnproto_test::capnp::test::TestInterface::BazParams::Builder::initS
            ((Builder *)&promise2.super_Pipeline._typeless.ops.disposer,(Builder *)local_150);
  builder._builder.capTable = (CapTableBuilder *)local_180;
  builder._builder.segment = (SegmentBuilder *)uStack_188;
  builder._builder.data = (void *)uStack_178;
  builder._builder.pointers = (WirePointer *)local_170;
  builder._builder.dataSize = (int)in_stack_fffffffffffffc80;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc80 >> 0x30);
  initTestMessage(builder);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
          *)local_1c8,(int)local_150,__buf_00,local_170,in_R8D);
  request3.hook.ptr._7_1_ = 0;
  kj::Maybe<capnp::MessageSize>::Maybe
            ((Maybe<capnp::MessageSize> *)&promise3.super_PromiseBase.node.ptr,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            ((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
              *)local_208,(Client *)local_80,
             (Maybe<capnp::MessageSize> *)&promise3.super_PromiseBase.node.ptr);
  kj::Maybe<capnp::MessageSize>::~Maybe
            ((Maybe<capnp::MessageSize> *)&promise3.super_PromiseBase.node.ptr);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)(local_269 + 1),(int)local_208,__buf_01,local_170,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>>::
  then<capnp::_::(anonymous_namespace)::TestCase43::run()::__0,capnp::_::(anonymous_namespace)::TestCase43::run()::__1>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>> *)
             local_230,(Type *)(local_269 + 1),(Type *)local_269);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)
             (local_269 + 1));
  if (client._16_4_ != 0) {
    response1.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)response1.hook.ptr._7_1_ != false) {
      response1.hook.ptr._0_4_ = 0;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x45,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",(int *)&response1.hook.ptr,
                 (int *)&client.field_0x10);
      response1.hook.ptr._7_1_ = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_2c0,&request2.hook.ptr);
  _auStack_2d0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_2c0);
  bVar1 = kj::operator==("foo",(StringPtr *)auStack_2d0);
  if (!bVar1) {
    local_2d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2d1 != false) {
      RVar2 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_2c0);
      response2.hook.ptr = RVar2.super_StringPtr.content.ptr;
      kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x49,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response1.getX())\", \"foo\", response1.getX()"
                 ,(char (*) [47])"failed: expected (\"foo\") == (response1.getX())",
                 (char (*) [4])0xa4c8db,(Reader *)&response2.hook.ptr);
      local_2d1 = false;
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_> *)
             local_328,local_1c8);
  kj::Promise<void>::wait((Promise<void> *)local_230,local_58);
  if (client._16_4_ != 2) {
    _kj_shouldLog_3 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_330 = 2;
      kj::_::Debug::log<char_const(&)[36],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x4f,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
                 (char (*) [36])"failed: expected (2) == (callCount)",&local_330,
                 (int *)&client.field_0x10);
      _kj_shouldLog_3 = false;
    }
  }
  if ((request3.hook.ptr._7_1_ & 1) == 0) {
    local_331 = kj::_::Debug::shouldLog(ERROR);
    while (local_331 != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x50,ERROR,"\"failed: expected \" \"barFailed\"",
                 (char (*) [27])"failed: expected barFailed");
      local_331 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::BazResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::BazResults> *)local_328);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_2c0);
  kj::Promise<void>::~Promise((Promise<void> *)local_230);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
              *)local_208);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> *)local_1c8);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
              *)local_150);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)
             &request2.hook.ptr);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_c8);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_80);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, Basic) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestInterface::Client client(kj::heap<TestInterfaceImpl>(callCount));

  auto request1 = client.fooRequest();
  request1.setI(123);
  request1.setJ(true);
  auto promise1 = request1.send();

  auto request2 = client.bazRequest();
  initTestMessage(request2.initS());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.barRequest();
  auto promise3 = request3.send().then(
      [](Response<test::TestInterface::BarResults>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        EXPECT_EQ(kj::Exception::Type::UNIMPLEMENTED, e.getType());
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("foo", response1.getX());

  auto response2 = promise2.wait(waitScope);

  promise3.wait(waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}